

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Kernel::Clause_*>::DArray(DArray<Kernel::Clause_*> *this,DArray<Kernel::Clause_*> *o)

{
  size_t sVar1;
  Clause **ppCVar2;
  size_t i;
  size_t sVar3;
  
  sVar1 = o->_size;
  this->_size = sVar1;
  this->_capacity = sVar1;
  if (sVar1 == 0) {
    this->_array = (Clause **)0x0;
  }
  else {
    ppCVar2 = (Clause **)Lib::alloc(sVar1 << 3);
    this->_array = ppCVar2;
    sVar1 = this->_size;
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      this->_array[sVar3] = o->_array[sVar3];
    }
  }
  return;
}

Assistant:

explicit DArray(const DArray& o)
    : _size(o.size()), _capacity(o.size())
  {
    if(_size==0) {
      _array=0;
      return;
    }
    void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
    _array = static_cast<C*>(mem);
    for(size_t i=0; i<_size; i++) {
      ::new (&_array[i]) C(o[i]);
    }
  }